

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::_setToDoubleFast(DecimalQuantity *this,double n)

{
  int iVar1;
  double dVar2;
  int64_t result;
  int32_t i_1;
  int32_t i;
  int32_t fracLength;
  int32_t exponent;
  uint64_t ieeeBits;
  double n_local;
  DecimalQuantity *this_local;
  
  this->isApproximate = '\x01';
  this->origDouble = n;
  this->origDelta = 0;
  iVar1 = (((uint)((ulong)n >> 0x20) & 0x7ff00000) >> 0x14) - 0x3ff;
  if (((0x34 < iVar1) || ((double)(long)n != n)) || (NAN((double)(long)n) || NAN(n))) {
    iVar1 = (int)((double)(0x34 - iVar1) / 3.32192809489);
    result._0_4_ = iVar1;
    result._4_4_ = iVar1;
    ieeeBits = (uint64_t)n;
    if (iVar1 < 0) {
      for (; (int)result < -0x15; result._0_4_ = (int)result + 0x16) {
        ieeeBits = (uint64_t)((double)ieeeBits / 1e+22);
      }
      ieeeBits = (uint64_t)
                 ((double)ieeeBits /
                 *(double *)(::(anonymous_namespace)::DOUBLE_MULTIPLIERS + (long)-(int)result * 8));
    }
    else {
      for (; 0x15 < result._4_4_; result._4_4_ = result._4_4_ + -0x16) {
        ieeeBits = (uint64_t)((double)ieeeBits * 1e+22);
      }
      ieeeBits = (uint64_t)
                 (*(double *)(::(anonymous_namespace)::DOUBLE_MULTIPLIERS + (long)result._4_4_ * 8)
                 * (double)ieeeBits);
    }
    dVar2 = round((double)ieeeBits);
    if ((long)dVar2 != 0) {
      _setToLong(this,(long)dVar2);
      this->scale = this->scale - iVar1;
    }
  }
  else {
    _setToLong(this,(long)n);
  }
  return;
}

Assistant:

void DecimalQuantity::_setToDoubleFast(double n) {
    isApproximate = true;
    origDouble = n;
    origDelta = 0;

    // Make sure the double is an IEEE 754 double.  If not, fall back to the slow path right now.
    // TODO: Make a fast path for other types of doubles.
    if (!std::numeric_limits<double>::is_iec559) {
        convertToAccurateDouble();
        // Turn off the approximate double flag, since the value is now exact.
        isApproximate = false;
        origDouble = 0.0;
        return;
    }

    // To get the bits from the double, use memcpy, which takes care of endianness.
    uint64_t ieeeBits;
    uprv_memcpy(&ieeeBits, &n, sizeof(n));
    int32_t exponent = static_cast<int32_t>((ieeeBits & 0x7ff0000000000000L) >> 52) - 0x3ff;

    // Not all integers can be represented exactly for exponent > 52
    if (exponent <= 52 && static_cast<int64_t>(n) == n) {
        _setToLong(static_cast<int64_t>(n));
        return;
    }

    // 3.3219... is log2(10)
    auto fracLength = static_cast<int32_t> ((52 - exponent) / 3.32192809489);
    if (fracLength >= 0) {
        int32_t i = fracLength;
        // 1e22 is the largest exact double.
        for (; i >= 22; i -= 22) n *= 1e22;
        n *= DOUBLE_MULTIPLIERS[i];
    } else {
        int32_t i = fracLength;
        // 1e22 is the largest exact double.
        for (; i <= -22; i += 22) n /= 1e22;
        n /= DOUBLE_MULTIPLIERS[-i];
    }
    auto result = static_cast<int64_t>(std::round(n));
    if (result != 0) {
        _setToLong(result);
        scale -= fracLength;
    }
}